

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

bool cppcms::xss::validate(char *begin,char *end,rules *r)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  size_type sVar4;
  reference pvVar5;
  string *in_RSI;
  size_t *in_RDI;
  char *unaff_retaddr;
  string *in_stack_00000008;
  uint i_2;
  uint i_1;
  uint i;
  size_t size;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  parsed;
  string tmp;
  string temp_input;
  size_t dummy_count;
  string enc;
  rules *in_stack_00000130;
  entry *in_stack_00000138;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  *in_stack_00000250;
  char *in_stack_00000258;
  char *in_stack_00000260;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  entry *part;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  *in_stack_ffffffffffffff30;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  local_b0;
  size_t *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  pointer in_stack_ffffffffffffff80;
  string local_68 [32];
  undefined8 local_48;
  string local_40 [40];
  string *local_18;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar6;
  
  local_18 = in_RSI;
  rules::encoding_abi_cxx11_((rules *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28))
  ;
  local_48 = 0;
  std::__cxx11::string::string(local_68);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = encoding::is_ascii_compatible((string *)0x45b3af);
    if (bVar1) {
      bVar1 = encoding::valid(in_stack_00000008,unaff_retaddr,
                              (char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                              in_RDI);
      if (!bVar1) {
        bVar6 = 0;
        goto LAB_0045b712;
      }
    }
    else {
      booster::locale::conv::to_utf<char>
                (&stack0xffffffffffffff68,(char *)in_RDI,local_18,(method_type)local_40);
      std::__cxx11::string::swap(local_68);
      in_stack_ffffffffffffff30 =
           (vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
            *)std::__cxx11::string::c_str();
      lVar3 = std::__cxx11::string::size();
      local_18 = (string *)
                 ((long)&(in_stack_ffffffffffffff30->
                         super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar3);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
      bVar1 = encoding::valid((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                              in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (!bVar1) {
        bVar6 = 0;
        goto LAB_0045b712;
      }
    }
  }
  part = (entry *)&local_b0;
  std::
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ::vector((vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
            *)0x45b53b);
  anon_unknown_8::split_to_parts(in_stack_00000260,in_stack_00000258,in_stack_00000250);
  sVar4 = std::
          vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
          ::size(&local_b0);
  for (local_bc = 0; local_bc < sVar4; local_bc = local_bc + 1) {
    pvVar5 = std::
             vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
             ::operator[](&local_b0,(ulong)local_bc);
    if (pvVar5->type == invalid_data) {
      bVar6 = 0;
      goto LAB_0045b708;
    }
    std::
    vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    ::operator[](&local_b0,(ulong)local_bc);
    anon_unknown_8::parse_part(part);
    pvVar5 = std::
             vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
             ::operator[](&local_b0,(ulong)local_bc);
    if (pvVar5->type == invalid_data) {
      bVar6 = 0;
      goto LAB_0045b708;
    }
  }
  rules::html((rules *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  anon_unknown_8::validate_nesting
            ((vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
              *)size,i._3_1_);
  for (local_c0 = 0; local_c0 < sVar4; local_c0 = local_c0 + 1) {
    pvVar5 = std::
             vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
             ::operator[](&local_b0,(ulong)local_c0);
    if (pvVar5->type == invalid_data) {
      bVar6 = 0;
      goto LAB_0045b708;
    }
  }
  for (local_c4 = 0; local_c4 < sVar4; local_c4 = local_c4 + 1) {
    std::
    vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    ::operator[](&local_b0,(ulong)local_c4);
    bVar1 = anon_unknown_8::validate_entry_by_rules(in_stack_00000138,in_stack_00000130);
    if (!bVar1) {
      bVar6 = 0;
      goto LAB_0045b708;
    }
  }
  bVar6 = 1;
LAB_0045b708:
  std::
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ::~vector(in_stack_ffffffffffffff30);
LAB_0045b712:
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_40);
  return (bool)(bVar6 & 1);
}

Assistant:

bool validate(char const *begin,char const *end,rules const &r)
	{
		std::string enc = r.encoding();
		size_t dummy_count = 0;
		
		std::string temp_input;

		if(!enc.empty()) {
			if(encoding::is_ascii_compatible(enc)) {
				if(!encoding::valid(enc,begin,end,dummy_count))
					return false;
			}
			else {
				try {
					std::string tmp = 
						booster::locale::conv::to_utf<char>(
							begin,end,enc,booster::locale::conv::stop);
					temp_input.swap(tmp);
					begin = temp_input.c_str();
					end = begin + temp_input.size();
				}
				catch(...) {
					return false;
				}
				if(!encoding::valid("UTF-8",begin,end,dummy_count))
					return false;
			}
		}
		
		std::vector<entry> parsed;
		
		split_to_parts(begin,end,parsed);

		size_t size = parsed.size();

		for(unsigned i=0;i<size;i++) {
			if(parsed[i].type == invalid_data)
				return false;
			parse_part(parsed[i]);
			if(parsed[i].type == invalid_data)
				return false;
		}
		
		validate_nesting(parsed,r.html() == rules::xhtml_input);

		for(unsigned i=0;i<size;i++)
			if(parsed[i].type == invalid_data)
				return false;

		for(unsigned i=0;i<size;i++) {
			if(!validate_entry_by_rules(parsed[i],r))
				return false;
		}

		return true;

	}